

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265d_ps.c
# Opt level: O0

RK_S32 compare_sps(HEVCSPS *openhevc_sps,HEVCSPS *sps)

{
  HEVCSPS *sps_local;
  HEVCSPS *openhevc_sps_local;
  
  if (openhevc_sps->vps_id == sps->vps_id) {
    if (openhevc_sps->sps_id == sps->sps_id) {
      if (openhevc_sps->chroma_format_idc == sps->chroma_format_idc) {
        if (openhevc_sps->separate_colour_plane_flag == sps->separate_colour_plane_flag) {
          if (openhevc_sps->output_width == sps->output_width) {
            if (openhevc_sps->output_height == sps->output_height) {
              if (openhevc_sps->bit_depth == sps->bit_depth) {
                if (openhevc_sps->bit_depth_chroma == sps->bit_depth_chroma) {
                  if (openhevc_sps->pixel_shift == sps->pixel_shift) {
                    if (openhevc_sps->log2_max_poc_lsb == sps->log2_max_poc_lsb) {
                      if (openhevc_sps->pcm_enabled_flag == sps->pcm_enabled_flag) {
                        if (openhevc_sps->max_sub_layers == sps->max_sub_layers) {
                          if (openhevc_sps->scaling_list_enable_flag ==
                              sps->scaling_list_enable_flag) {
                            if (openhevc_sps->nb_st_rps == sps->nb_st_rps) {
                              if (openhevc_sps->amp_enabled_flag == sps->amp_enabled_flag) {
                                if (openhevc_sps->sao_enabled == sps->sao_enabled) {
                                  if (openhevc_sps->long_term_ref_pics_present_flag ==
                                      sps->long_term_ref_pics_present_flag) {
                                    if (openhevc_sps->num_long_term_ref_pics_sps ==
                                        sps->num_long_term_ref_pics_sps) {
                                      if (openhevc_sps->sps_temporal_mvp_enabled_flag ==
                                          sps->sps_temporal_mvp_enabled_flag) {
                                        if (openhevc_sps->sps_strong_intra_smoothing_enable_flag ==
                                            sps->sps_strong_intra_smoothing_enable_flag) {
                                          if (openhevc_sps->log2_min_cb_size ==
                                              sps->log2_min_cb_size) {
                                            if (openhevc_sps->log2_diff_max_min_coding_block_size ==
                                                sps->log2_diff_max_min_coding_block_size) {
                                              if (openhevc_sps->log2_min_tb_size ==
                                                  sps->log2_min_tb_size) {
                                                if (openhevc_sps->log2_max_trafo_size ==
                                                    sps->log2_max_trafo_size) {
                                                  if (openhevc_sps->log2_ctb_size ==
                                                      sps->log2_ctb_size) {
                                                    if (openhevc_sps->log2_min_pu_size ==
                                                        sps->log2_min_pu_size) {
                                                      if (openhevc_sps->
                                                          max_transform_hierarchy_depth_inter ==
                                                          sps->max_transform_hierarchy_depth_inter)
                                                      {
                                                        if (openhevc_sps->
                                                            max_transform_hierarchy_depth_intra ==
                                                            sps->max_transform_hierarchy_depth_intra
                                                           ) {
                                                          if (openhevc_sps->width == sps->width) {
                                                            if (openhevc_sps->height == sps->height)
                                                            {
                                                              if (openhevc_sps->ctb_width ==
                                                                  sps->ctb_width) {
                                                                if (openhevc_sps->ctb_height ==
                                                                    sps->ctb_height) {
                                                                  if (openhevc_sps->ctb_size ==
                                                                      sps->ctb_size) {
                                                                    if (openhevc_sps->min_cb_width
                                                                        == sps->min_cb_width) {
                                                                      if (openhevc_sps->
                                                                          min_cb_height ==
                                                                          sps->min_cb_height) {
                                                                        if (openhevc_sps->
                                                                            min_tb_width ==
                                                                            sps->min_tb_width) {
                                                                          if (openhevc_sps->
                                                                              min_tb_height ==
                                                                              sps->min_tb_height) {
                                                                            if (openhevc_sps->
                                                                                min_pu_width ==
                                                                                sps->min_pu_width) {
                                                                              if (openhevc_sps->
                                                                                  min_pu_height ==
                                                                                  sps->min_pu_height
                                                                                 ) {
                                                                                if (openhevc_sps->
                                                                                    qp_bd_offset ==
                                                                                    sps->
                                                  qp_bd_offset) {
                                                    openhevc_sps_local._4_4_ = 0;
                                                  }
                                                  else {
                                                    _mpp_log_l(4,"H265PARSER_PS",
                                                               "qp_bd_offset diff \n",(char *)0x0);
                                                    openhevc_sps_local._4_4_ = -1;
                                                  }
                                                  }
                                                  else {
                                                    _mpp_log_l(4,"H265PARSER_PS",
                                                               "min_pu_height diff\n",(char *)0x0);
                                                    openhevc_sps_local._4_4_ = -1;
                                                  }
                                                  }
                                                  else {
                                                    _mpp_log_l(4,"H265PARSER_PS",
                                                               "min_pu_width diff\n",(char *)0x0);
                                                    openhevc_sps_local._4_4_ = -1;
                                                  }
                                                  }
                                                  else {
                                                    _mpp_log_l(4,"H265PARSER_PS",
                                                               "min_tb_height diff\n",(char *)0x0);
                                                    openhevc_sps_local._4_4_ = -1;
                                                  }
                                                  }
                                                  else {
                                                    _mpp_log_l(4,"H265PARSER_PS",
                                                               "min_tb_width diff\n",(char *)0x0);
                                                    openhevc_sps_local._4_4_ = -1;
                                                  }
                                                  }
                                                  else {
                                                    _mpp_log_l(4,"H265PARSER_PS",
                                                               "min_cb_height diff\n",(char *)0x0);
                                                    openhevc_sps_local._4_4_ = -1;
                                                  }
                                                  }
                                                  else {
                                                    _mpp_log_l(4,"H265PARSER_PS",
                                                               "min_cb_width diff\n",(char *)0x0);
                                                    openhevc_sps_local._4_4_ = -1;
                                                  }
                                                  }
                                                  else {
                                                    _mpp_log_l(4,"H265PARSER_PS","ctb_size diff\n",
                                                               (char *)0x0);
                                                    openhevc_sps_local._4_4_ = -1;
                                                  }
                                                  }
                                                  else {
                                                    _mpp_log_l(4,"H265PARSER_PS","ctb_height diff\n"
                                                               ,(char *)0x0);
                                                    openhevc_sps_local._4_4_ = -1;
                                                  }
                                                  }
                                                  else {
                                                    _mpp_log_l(4,"H265PARSER_PS","ctb_width diff\n",
                                                               (char *)0x0);
                                                    openhevc_sps_local._4_4_ = -1;
                                                  }
                                                  }
                                                  else {
                                                    _mpp_log_l(4,"H265PARSER_PS","height diff\n",
                                                               (char *)0x0);
                                                    openhevc_sps_local._4_4_ = -1;
                                                  }
                                                  }
                                                  else {
                                                    _mpp_log_l(4,"H265PARSER_PS","width diff\n",
                                                               (char *)0x0);
                                                    openhevc_sps_local._4_4_ = -1;
                                                  }
                                                  }
                                                  else {
                                                    _mpp_log_l(4,"H265PARSER_PS",
                                                                                                                              
                                                  "max_transform_hierarchy_depth_intra diff\n",
                                                  (char *)0x0);
                                                  openhevc_sps_local._4_4_ = -1;
                                                  }
                                                  }
                                                  else {
                                                    _mpp_log_l(4,"H265PARSER_PS",
                                                                                                                              
                                                  "max_transform_hierarchy_depth_inter diff\n",
                                                  (char *)0x0);
                                                  openhevc_sps_local._4_4_ = -1;
                                                  }
                                                  }
                                                  else {
                                                    _mpp_log_l(4,"H265PARSER_PS",
                                                               "log2_min_pu_size diff\n",(char *)0x0
                                                              );
                                                    openhevc_sps_local._4_4_ = -1;
                                                  }
                                                  }
                                                  else {
                                                    _mpp_log_l(4,"H265PARSER_PS",
                                                               "log2_ctb_size diff\n",(char *)0x0);
                                                    openhevc_sps_local._4_4_ = -1;
                                                  }
                                                }
                                                else {
                                                  _mpp_log_l(4,"H265PARSER_PS",
                                                             "log2_max_trafo_size diff\n",
                                                             (char *)0x0);
                                                  openhevc_sps_local._4_4_ = -1;
                                                }
                                              }
                                              else {
                                                _mpp_log_l(4,"H265PARSER_PS",
                                                           "log2_min_tb_size diff\n",(char *)0x0);
                                                openhevc_sps_local._4_4_ = -1;
                                              }
                                            }
                                            else {
                                              _mpp_log_l(4,"H265PARSER_PS",
                                                                                                                  
                                                  "log2_diff_max_min_coding_block_size diff\n",
                                                  (char *)0x0);
                                              openhevc_sps_local._4_4_ = -1;
                                            }
                                          }
                                          else {
                                            _mpp_log_l(4,"H265PARSER_PS","log2_min_cb_size diff\n",
                                                       (char *)0x0);
                                            openhevc_sps_local._4_4_ = -1;
                                          }
                                        }
                                        else {
                                          _mpp_log_l(4,"H265PARSER_PS",
                                                     "sps_strong_intra_smoothing_enable_flag diff\n"
                                                     ,(char *)0x0);
                                          openhevc_sps_local._4_4_ = -1;
                                        }
                                      }
                                      else {
                                        _mpp_log_l(4,"H265PARSER_PS",
                                                   "sps_temporal_mvp_enabled_flag diff\n",
                                                   (char *)0x0);
                                        openhevc_sps_local._4_4_ = -1;
                                      }
                                    }
                                    else {
                                      _mpp_log_l(4,"H265PARSER_PS",
                                                 "num_long_term_ref_pics_sps diff\n",(char *)0x0);
                                      openhevc_sps_local._4_4_ = -1;
                                    }
                                  }
                                  else {
                                    _mpp_log_l(4,"H265PARSER_PS",
                                               "long_term_ref_pics_present_flag diff\n",(char *)0x0)
                                    ;
                                    openhevc_sps_local._4_4_ = -1;
                                  }
                                }
                                else {
                                  _mpp_log_l(4,"H265PARSER_PS","sao_enabled diff\n",(char *)0x0);
                                  openhevc_sps_local._4_4_ = -1;
                                }
                              }
                              else {
                                _mpp_log_l(4,"H265PARSER_PS",
                                           " amp_enabled_flag diff openhevc %d != %d\n",(char *)0x0,
                                           (ulong)openhevc_sps->amp_enabled_flag,
                                           (ulong)sps->amp_enabled_flag);
                                openhevc_sps_local._4_4_ = -1;
                              }
                            }
                            else {
                              _mpp_log_l(4,"H265PARSER_PS","nb_st_rps diff\n",(char *)0x0);
                              openhevc_sps_local._4_4_ = -1;
                            }
                          }
                          else {
                            _mpp_log_l(4,"H265PARSER_PS","scaling_list_enable_flag diff\n",
                                       (char *)0x0);
                            openhevc_sps_local._4_4_ = -1;
                          }
                        }
                        else {
                          _mpp_log_l(4,"H265PARSER_PS","max_sub_layers diff\n",(char *)0x0);
                          openhevc_sps_local._4_4_ = -1;
                        }
                      }
                      else {
                        _mpp_log_l(4,"H265PARSER_PS","pcm_enabled_flag diff\n",(char *)0x0);
                        openhevc_sps_local._4_4_ = -1;
                      }
                    }
                    else {
                      _mpp_log_l(4,"H265PARSER_PS","log2_max_poc_lsb diff\n",(char *)0x0);
                      openhevc_sps_local._4_4_ = -1;
                    }
                  }
                  else {
                    _mpp_log_l(4,"H265PARSER_PS","pixel_shift diff\n",(char *)0x0);
                    openhevc_sps_local._4_4_ = -1;
                  }
                }
                else {
                  _mpp_log_l(4,"H265PARSER_PS","bit_depth_chroma diff\n",(char *)0x0);
                  openhevc_sps_local._4_4_ = -1;
                }
              }
              else {
                _mpp_log_l(4,"H265PARSER_PS","bit_depth diff\n",(char *)0x0);
                openhevc_sps_local._4_4_ = -1;
              }
            }
            else {
              _mpp_log_l(4,"H265PARSER_PS","output_height diff\n",(char *)0x0);
              openhevc_sps_local._4_4_ = -1;
            }
          }
          else {
            _mpp_log_l(4,"H265PARSER_PS","output_width diff\n",(char *)0x0);
            openhevc_sps_local._4_4_ = -1;
          }
        }
        else {
          _mpp_log_l(4,"H265PARSER_PS","separate_colour_plane_flag diff\n",(char *)0x0);
          openhevc_sps_local._4_4_ = -1;
        }
      }
      else {
        _mpp_log_l(4,"H265PARSER_PS","chroma_format_idc diff\n",(char *)0x0);
        openhevc_sps_local._4_4_ = -1;
      }
    }
    else {
      _mpp_log_l(4,"H265PARSER_PS","sps_id diff\n",(char *)0x0);
      openhevc_sps_local._4_4_ = -1;
    }
  }
  else {
    _mpp_log_l(4,"H265PARSER_PS","vps_id diff\n",(char *)0x0);
    openhevc_sps_local._4_4_ = -1;
  }
  return openhevc_sps_local._4_4_;
}

Assistant:

static RK_S32 compare_sps(HEVCSPS *openhevc_sps, HEVCSPS *sps)
{
    if (openhevc_sps->vps_id != sps->vps_id) {
        mpp_log("vps_id diff\n");
        return -1;
    }
    if (openhevc_sps->sps_id != sps->sps_id) {
        mpp_log("sps_id diff\n");
        return -1;
    }
    if (openhevc_sps->chroma_format_idc != sps->chroma_format_idc) {
        mpp_log("chroma_format_idc diff\n");
        return -1;
    }
    if (openhevc_sps->separate_colour_plane_flag
        != sps->separate_colour_plane_flag) {
        mpp_log("separate_colour_plane_flag diff\n");
        return -1;
    }

    if (openhevc_sps->output_width != sps->output_width) {
        mpp_log("output_width diff\n");
        return -1;
    }
    if (openhevc_sps->output_height != sps->output_height) {
        mpp_log("output_height diff\n");
        return -1;
    }

    if (openhevc_sps->bit_depth != sps->bit_depth) {
        mpp_log("bit_depth diff\n");
        return -1;
    }
    if (openhevc_sps->bit_depth_chroma != sps->bit_depth_chroma) {
        mpp_log("bit_depth_chroma diff\n");
        return -1;
    }
    if (openhevc_sps->pixel_shift != sps->pixel_shift) {
        mpp_log("pixel_shift diff\n");
        return -1;
    }
    // openhevc_sps->pix_fmt;

    if (openhevc_sps->log2_max_poc_lsb != sps->log2_max_poc_lsb) {
        mpp_log("log2_max_poc_lsb diff\n");
        return -1;
    }
    if (openhevc_sps->pcm_enabled_flag != sps->pcm_enabled_flag) {
        mpp_log("pcm_enabled_flag diff\n");
        return -1;
    }

    if (openhevc_sps->max_sub_layers != sps->max_sub_layers) {
        mpp_log("max_sub_layers diff\n");
        return -1;
    }

    if (openhevc_sps->scaling_list_enable_flag != sps->scaling_list_enable_flag) {
        mpp_log("scaling_list_enable_flag diff\n");
        return -1;
    }

    if (openhevc_sps->nb_st_rps != sps->nb_st_rps) {
        mpp_log("nb_st_rps diff\n");
        return -1;
    }

    if (openhevc_sps->amp_enabled_flag != sps->amp_enabled_flag) {
        mpp_log(" amp_enabled_flag diff openhevc %d != %d\n", openhevc_sps->amp_enabled_flag, sps->amp_enabled_flag);
        return -1;
    }
    if (openhevc_sps->sao_enabled != sps->sao_enabled) {
        mpp_log("sao_enabled diff\n");
        return -1;
    }

    if (openhevc_sps->long_term_ref_pics_present_flag
        != sps->long_term_ref_pics_present_flag) {
        mpp_log("long_term_ref_pics_present_flag diff\n");
        return -1;
    }
    if (openhevc_sps->num_long_term_ref_pics_sps !=
        sps->num_long_term_ref_pics_sps) {
        mpp_log("num_long_term_ref_pics_sps diff\n");
        return -1;
    }

    if (openhevc_sps->sps_temporal_mvp_enabled_flag !=
        sps->sps_temporal_mvp_enabled_flag) {
        mpp_log("sps_temporal_mvp_enabled_flag diff\n");
        return -1;
    }
    if (openhevc_sps->sps_strong_intra_smoothing_enable_flag !=
        sps->sps_strong_intra_smoothing_enable_flag) {
        mpp_log("sps_strong_intra_smoothing_enable_flag diff\n");
        return -1;
    }

    if (openhevc_sps->log2_min_cb_size != sps->log2_min_cb_size) {
        mpp_log("log2_min_cb_size diff\n");
        return -1;
    }
    if (openhevc_sps->log2_diff_max_min_coding_block_size !=
        sps->log2_diff_max_min_coding_block_size) {
        mpp_log("log2_diff_max_min_coding_block_size diff\n");
        return -1;
    }
    if (openhevc_sps->log2_min_tb_size != sps->log2_min_tb_size) {
        mpp_log("log2_min_tb_size diff\n");
        return -1;
    }
    if (openhevc_sps->log2_max_trafo_size != sps->log2_max_trafo_size) {
        mpp_log("log2_max_trafo_size diff\n");
        return -1;
    }
    if (openhevc_sps->log2_ctb_size != sps->log2_ctb_size) {
        mpp_log("log2_ctb_size diff\n");
        return -1;
    }
    if (openhevc_sps->log2_min_pu_size != sps->log2_min_pu_size) {
        mpp_log("log2_min_pu_size diff\n");
        return -1;
    }

    if (openhevc_sps->max_transform_hierarchy_depth_inter !=
        sps->max_transform_hierarchy_depth_inter) {
        mpp_log("max_transform_hierarchy_depth_inter diff\n");
        return -1;
    }
    if (openhevc_sps->max_transform_hierarchy_depth_intra !=
        sps->max_transform_hierarchy_depth_intra) {
        mpp_log("max_transform_hierarchy_depth_intra diff\n");
        return -1;
    }

    if (openhevc_sps->width != sps->width) {
        mpp_log("width diff\n");
        return -1;
    }

    if (openhevc_sps->height != sps->height) {
        mpp_log("height diff\n");
        return -1;
    }

    if (openhevc_sps->ctb_width != sps->ctb_width) {
        mpp_log("ctb_width diff\n");
        return -1;
    }

    if ( openhevc_sps->ctb_height != sps->ctb_height) {
        mpp_log("ctb_height diff\n");
        return -1;
    }

    if (openhevc_sps->ctb_size != sps->ctb_size) {
        mpp_log("ctb_size diff\n");
        return -1;
    }

    if (openhevc_sps->min_cb_width != sps->min_cb_width) {
        mpp_log("min_cb_width diff\n");
        return -1;
    }

    if (openhevc_sps->min_cb_height != sps->min_cb_height) {
        mpp_log("min_cb_height diff\n");
        return -1;
    }

    if (openhevc_sps->min_tb_width != sps->min_tb_width) {
        mpp_log("min_tb_width diff\n");
        return -1;
    }

    if (openhevc_sps->min_tb_height != sps->min_tb_height) {
        mpp_log("min_tb_height diff\n");
        return -1;
    }

    if (openhevc_sps->min_pu_width != sps->min_pu_width) {
        mpp_log("min_pu_width diff\n");
        return -1;
    }

    if (openhevc_sps->min_pu_height != sps->min_pu_height) {
        mpp_log("min_pu_height diff\n");
        return -1;
    }

    if (openhevc_sps->qp_bd_offset != sps->qp_bd_offset) {
        mpp_log("qp_bd_offset diff \n");
        return -1;
    }
    return 0;
}